

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

void ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 in_EAX;
  int iVar7;
  ZSTD_paramSwitch_e ZVar8;
  ZSTD_strategy ZVar9;
  ZSTD_paramSwitch_e ZVar10;
  undefined1 auVar11 [16];
  
  auVar11._0_4_ = -(uint)(0x7fffffe9 < (int)((params->cParams).windowLog - 0x20 ^ 0x80000000));
  auVar11._4_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).chainLog - 0x1f ^ 0x80000000));
  auVar11._8_4_ = -(uint)(0x7fffffe6 < (int)((params->cParams).hashLog - 0x1f ^ 0x80000000));
  auVar11._12_4_ = -(uint)(0x7fffffe1 < (int)((params->cParams).searchLog - 0x1f ^ 0x80000000));
  iVar7 = movmskps(in_EAX,auVar11);
  if ((((iVar7 == 0xf) && (0xfffffffa < (params->cParams).minMatch - 8)) &&
      ((params->cParams).targetLength < 0x20001)) &&
     (0xfffffff6 < (params->cParams).strategy + ~ZSTD_btultra2)) {
    memset(cctxParams,0,0xd0);
    uVar1 = (params->cParams).chainLog;
    uVar2 = (params->cParams).hashLog;
    uVar3 = (params->cParams).searchLog;
    uVar4 = (params->cParams).searchLog;
    uVar5 = (params->cParams).minMatch;
    uVar6 = (params->cParams).targetLength;
    ZVar9 = (params->cParams).strategy;
    (cctxParams->cParams).windowLog = (params->cParams).windowLog;
    (cctxParams->cParams).chainLog = uVar1;
    (cctxParams->cParams).hashLog = uVar2;
    (cctxParams->cParams).searchLog = uVar3;
    (cctxParams->cParams).searchLog = uVar4;
    (cctxParams->cParams).minMatch = uVar5;
    (cctxParams->cParams).targetLength = uVar6;
    (cctxParams->cParams).strategy = ZVar9;
    iVar7 = (params->fParams).checksumFlag;
    (cctxParams->fParams).contentSizeFlag = (params->fParams).contentSizeFlag;
    (cctxParams->fParams).checksumFlag = iVar7;
    (cctxParams->fParams).noDictIDFlag = (params->fParams).noDictIDFlag;
    cctxParams->compressionLevel = compressionLevel;
    ZVar9 = (params->cParams).strategy;
    ZVar8 = ZSTD_ps_disable;
    ZVar10 = ZSTD_ps_disable;
    if (0xfffffffc < ZVar9 - ZSTD_btlazy2) {
      ZVar9 = (params->cParams).strategy;
      ZVar10 = ((params->cParams).windowLog < 0xf) + ZSTD_ps_enable;
    }
    cctxParams->useRowMatchFinder = ZVar10;
    if (ZSTD_btlazy2 < ZVar9) {
      ZVar8 = ((params->cParams).windowLog < 0x11) + ZSTD_ps_enable;
    }
    cctxParams->useBlockSplitter = ZVar8;
    ZVar8 = ZSTD_ps_disable;
    if (ZSTD_btlazy2 < (params->cParams).strategy) {
      ZVar8 = ((params->cParams).windowLog < 0x1b) + ZSTD_ps_enable;
    }
    (cctxParams->ldmParams).enableLdm = ZVar8;
    cctxParams->maxBlockSize = 0x20000;
    cctxParams->searchForExternalRepcodes = (compressionLevel < 10) + ZSTD_ps_enable;
    return;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                ,0x17f,
                "void ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params *, const ZSTD_parameters *, int)"
               );
}

Assistant:

static void
ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams,
                        const ZSTD_parameters* params,
                              int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    cctxParams->useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter, &params->cParams);
    cctxParams->ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams->ldmParams.enableLdm, &params->cParams);
    cctxParams->validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams->searchForExternalRepcodes, compressionLevel);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d, useBlockSplitter=%d ldm=%d",
                cctxParams->useRowMatchFinder, cctxParams->useBlockSplitter, cctxParams->ldmParams.enableLdm);
}